

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_entry.h
# Opt level: O0

void __thiscall
NewMempoolTransactionInfo::NewMempoolTransactionInfo
          (NewMempoolTransactionInfo *this,CTransactionRef *tx,CAmount *fee,int64_t vsize,
          uint height,bool mempool_limit_bypassed,bool submitted_in_package,
          bool chainstate_is_current,bool has_no_mempool_parents)

{
  long lVar1;
  byte bVar2;
  CTransactionRef *in_RCX;
  byte bVar3;
  TransactionInfo *in_RDX;
  byte bVar4;
  int64_t in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  long in_FS_OFFSET;
  byte in_stack_00000008;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = in_R9B & 1;
  bVar3 = in_stack_00000008 & 1;
  bVar2 = (byte)vsize & 1;
  TransactionInfo::TransactionInfo
            (in_RDX,in_RCX,
             (CAmount *)
             (CONCAT44(in_R8D,CONCAT13(in_R9B,CONCAT12(in_stack_00000008,
                                                       CONCAT11(has_no_mempool_parents,(byte)vsize))
                                      )) & 0xffffffff0101ff01),in_RDI,(uint)((ulong)in_RCX >> 0x20))
  ;
  *(byte *)(in_RDI + 0x28) = bVar4 & 1;
  *(byte *)(in_RDI + 0x29) = bVar3 & 1;
  *(byte *)(in_RDI + 0x2a) = has_no_mempool_parents & 1;
  *(byte *)(in_RDI + 0x2b) = bVar2 & 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit NewMempoolTransactionInfo(const CTransactionRef& tx, const CAmount& fee,
                                       const int64_t vsize, const unsigned int height,
                                       const bool mempool_limit_bypassed, const bool submitted_in_package,
                                       const bool chainstate_is_current,
                                       const bool has_no_mempool_parents)
        : info{tx, fee, vsize, height},
          m_mempool_limit_bypassed{mempool_limit_bypassed},
          m_submitted_in_package{submitted_in_package},
          m_chainstate_is_current{chainstate_is_current},
          m_has_no_mempool_parents{has_no_mempool_parents} {}